

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

bool rsg::SqrtOp::transformValueRange(float outMin,float outMax,float *inMin,float *inMax)

{
  float fVar1;
  float rangeMax;
  float rangeMin;
  float *inMax_local;
  float *inMin_local;
  float outMax_local;
  float outMin_local;
  
  if ((outMax < 0.0) || (4.0 < outMin)) {
    outMax_local._3_1_ = false;
  }
  else {
    fVar1 = deFloatMax(outMin,0.0);
    *inMin = fVar1;
    fVar1 = deFloatMin(outMax,4.0);
    *inMax = fVar1;
    *inMin = *inMin * *inMin;
    *inMax = *inMax * *inMax;
    outMax_local._3_1_ = true;
  }
  return outMax_local._3_1_;
}

Assistant:

static inline bool transformValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		// Limited due to accuracy reasons, should be 0..+inf
		const float rangeMin = 0.0f;
		const float rangeMax = 4.0f;

		if (outMax < rangeMin || outMin > rangeMax)
			return false; // Out of range

		inMin = deFloatMax(outMin, rangeMin);
		inMax = deFloatMin(outMax, rangeMax);

		inMin *= inMin;
		inMax *= inMax;

		return true;
	}